

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::doEncodeString(JsonGenerator *this,string *s)

{
  bool bVar1;
  int iVar2;
  JsonGenerator *__buf;
  JsonGenerator *__n;
  void *__buf_00;
  ulong in_RSI;
  JsonGenerator *in_RDI;
  undefined1 auVar3 [16];
  char *p;
  char *e;
  char *b;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  char c;
  JsonGenerator *this_00;
  JsonGenerator *local_28;
  JsonGenerator *local_18;
  
  local_28 = (JsonGenerator *)std::__cxx11::string::operator[](in_RSI);
  this_00 = local_28;
  auVar3 = std::__cxx11::string::size();
  __n = auVar3._0_8_;
  __buf = (JsonGenerator *)((long)&(this_00->out_).out_ + (long)&(__n->out_).out_);
  StreamWriter::write(&in_RDI->out_,0x22,auVar3._8_8_,(size_t)__n);
  local_18 = local_28;
  do {
    if (local_28 == __buf) {
      write(in_RDI,(int)local_18,__buf,(size_t)__n);
      StreamWriter::write(&in_RDI->out_,0x22,__buf_00,(size_t)__n);
      return;
    }
    iVar2 = (int)*(char *)&(local_28->out_).out_;
    c = (char)((ulong)in_RDI >> 0x38);
    if (iVar2 == 8) {
      __n = local_28;
      escape(this_00,c,(char *)CONCAT44(8,in_stack_ffffffffffffffc0),
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
LAB_0021bdca:
      local_18 = (JsonGenerator *)((long)&(local_28->out_).out_ + 1);
    }
    else {
      if (iVar2 == 9) {
        __n = local_28;
        escape(this_00,c,(char *)CONCAT44(9,in_stack_ffffffffffffffc0),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        goto LAB_0021bdca;
      }
      if (iVar2 == 10) {
        __n = local_28;
        escape(this_00,c,(char *)CONCAT44(10,in_stack_ffffffffffffffc0),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        goto LAB_0021bdca;
      }
      if (iVar2 == 0xc) {
        __n = local_28;
        escape(this_00,c,(char *)CONCAT44(0xc,in_stack_ffffffffffffffc0),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        goto LAB_0021bdca;
      }
      if (iVar2 == 0xd) {
        __n = local_28;
        escape(this_00,c,(char *)CONCAT44(0xd,in_stack_ffffffffffffffc0),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        goto LAB_0021bdca;
      }
      if (((iVar2 == 0x22) || (iVar2 == 0x2f)) || (iVar2 == 0x5c)) {
        __n = local_28;
        escape(this_00,c,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        goto LAB_0021bdca;
      }
      in_stack_ffffffffffffffc0 =
           CONCAT13(*(undefined1 *)&(local_28->out_).out_,(int3)in_stack_ffffffffffffffc0);
      std::locale::classic();
      bVar1 = std::iscntrl<char>((char)((uint)iVar2 >> 0x18),
                                 (locale *)
                                 CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      if (bVar1) {
        write(in_RDI,(int)local_18,local_28,(size_t)__n);
        escapeCtl((JsonGenerator *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbf);
        goto LAB_0021bdca;
      }
    }
    local_28 = (JsonGenerator *)((long)&(local_28->out_).out_ + 1);
  } while( true );
}

Assistant:

void doEncodeString(const std::string& s) {
        const char* b = &s[0];
        const char* e = b + s.size();
        out_.write('"');
        for (const char* p = b; p != e; p++) {
            switch (*p) {
            case '\\':
            case '"':
            case '/':
                escape(*p, b, p);
                break;
            case '\b':
                escape('b', b, p);
                break;
            case '\f':
                escape('f', b, p);
                break;
            case '\n':
                escape('n', b, p);
                break;
            case '\r':
                escape('r', b, p);
                break;
            case '\t':
                escape('t', b, p);
                break;
            default:
                if (! std::iscntrl(*p, std::locale::classic())) {
                    continue;
                }
                write(b, p);
                escapeCtl(*p);
                break;
            }
            b = p + 1;
        }
        write(b, e);
        out_.write('"');
    }